

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

uint Assimp::GetMeshVFormatUnique(aiMesh *pcMesh)

{
  aiVector3D *paVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  
  if (pcMesh != (aiMesh *)0x0) {
    paVar1 = pcMesh->mNormals;
    uVar3 = pcMesh->mNumVertices;
    bVar2 = aiMesh::HasTangentsAndBitangents(pcMesh);
    uVar3 = (uint)(uVar3 != 0 && paVar1 != (aiVector3D *)0x0) * 2 + (uint)bVar2 * 4 + 1;
    lVar5 = 0;
    while (((lVar5 != 8 && (pcMesh->mTextureCoords[lVar5] != (aiVector3D *)0x0)) &&
           (pcMesh->mNumVertices != 0))) {
      uVar6 = 0x10000 << ((byte)lVar5 & 0x1f);
      if (pcMesh->mNumUVComponents[lVar5] != 3) {
        uVar6 = 0;
      }
      uVar3 = 0x100 << ((byte)lVar5 & 0x1f) | uVar3 | uVar6;
      lVar5 = lVar5 + 1;
    }
    lVar5 = 0;
    while (((lVar5 != 8 && (pcMesh->mColors[lVar5] != (aiColor4D *)0x0)) &&
           (pcMesh->mNumVertices != 0))) {
      bVar4 = (byte)lVar5;
      lVar5 = lVar5 + 1;
      uVar3 = uVar3 | 0x1000000 << (bVar4 & 0x1f);
    }
    return uVar3;
  }
  __assert_fail("__null != pcMesh",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ProcessHelper.cpp"
                ,0xb6,"unsigned int Assimp::GetMeshVFormatUnique(const aiMesh *)");
}

Assistant:

unsigned int GetMeshVFormatUnique(const aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    // FIX: the hash may never be 0. Otherwise a comparison against
    // nullptr could be successful
    unsigned int iRet = 1;

    // normals
    if (pcMesh->HasNormals())iRet |= 0x2;
    // tangents and bitangents
    if (pcMesh->HasTangentsAndBitangents())iRet |= 0x4;

#ifdef BOOST_STATIC_ASSERT
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_COLOR_SETS);
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_TEXTURECOORDS);
#endif

    // texture coordinates
    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        iRet |= (0x100 << p);
        if (3 == pcMesh->mNumUVComponents[p])
            iRet |= (0x10000 << p);

        ++p;
    }
    // vertex colors
    p = 0;
    while (pcMesh->HasVertexColors(p))iRet |= (0x1000000 << p++);
    return iRet;
}